

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall btMultiBodyDynamicsWorld::forwardKinematics(btMultiBodyDynamicsWorld *this)

{
  int iVar1;
  long in_RDI;
  btMultiBody *bod;
  int b;
  btAlignedObjectArray<btVector3> local_origin;
  btAlignedObjectArray<btQuaternion> world_to_local;
  btAlignedObjectArray<btVector3> *in_stack_00000140;
  btAlignedObjectArray<btQuaternion> *in_stack_00000148;
  btMultiBody *in_stack_00000150;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 local_58;
  
  btAlignedObjectArray<btQuaternion>::btAlignedObjectArray
            ((btAlignedObjectArray<btQuaternion> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  btAlignedObjectArray<btVector3>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_58 = 0;
  while( true ) {
    iVar2 = local_58;
    iVar1 = btAlignedObjectArray<btMultiBody_*>::size
                      ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8));
    if (iVar1 <= iVar2) break;
    btAlignedObjectArray<btMultiBody_*>::operator[]
              ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8),local_58);
    btMultiBody::forwardKinematics(in_stack_00000150,in_stack_00000148,in_stack_00000140);
    local_58 = local_58 + 1;
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x24db2c);
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray
            ((btAlignedObjectArray<btQuaternion> *)0x24db36);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::forwardKinematics()
{
	btAlignedObjectArray<btQuaternion> world_to_local;
	btAlignedObjectArray<btVector3> local_origin;

	for (int b=0;b<m_multiBodies.size();b++)
	{
		btMultiBody* bod = m_multiBodies[b];
		bod->forwardKinematics(world_to_local,local_origin);
	}
}